

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O1

GLPipelineObj * __thiscall
Diligent::PipelineStateGLImpl::GetGLProgramPipeline
          (PipelineStateGLImpl *this,NativeGLContextType Context)

{
  SpinLock *this_00;
  GLuint GVar1;
  pointer ppVar2;
  pointer ppVar3;
  NativeGLContextType p_Var4;
  pointer ppVar5;
  byte bVar6;
  SHADER_TYPE SVar7;
  pointer ppVar8;
  ulong uVar9;
  long lVar10;
  GLPipelineObj *unaff_R15;
  bool bVar11;
  GLenum err;
  string msg;
  uint local_5c;
  NativeGLContextType local_58;
  string local_50;
  
  this_00 = &this->m_ProgPipelineLock;
  LOCK();
  bVar6 = (this->m_ProgPipelineLock).m_IsLocked._M_base._M_i;
  (this->m_ProgPipelineLock).m_IsLocked._M_base._M_i = true;
  UNLOCK();
  local_58 = Context;
  while ((bVar6 & 1) != 0) {
    Threading::SpinLock::Wait(this_00);
    LOCK();
    bVar6 = (this_00->m_IsLocked)._M_base._M_i;
    (this_00->m_IsLocked)._M_base._M_i = true;
    UNLOCK();
  }
  ppVar2 = (this->m_GLProgPipelines).
           super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->m_GLProgPipelines).
           super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar11 = ppVar2 == ppVar3;
  if (!bVar11) {
    p_Var4 = ppVar2->first;
    ppVar5 = ppVar2;
    unaff_R15 = &ppVar2->second;
    while (p_Var4 != local_58) {
      ppVar8 = ppVar5 + 1;
      bVar11 = ppVar8 == ppVar3;
      unaff_R15 = &ppVar2->second;
      if (bVar11) break;
      unaff_R15 = &ppVar5[1].second;
      ppVar5 = ppVar8;
      p_Var4 = ppVar8->first;
    }
  }
  if (bVar11) {
    local_50._M_dataplus._M_p._0_1_ = 1;
    std::
    vector<std::pair<__GLXcontextRec*,GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>,std::allocator<std::pair<__GLXcontextRec*,GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>>>
    ::emplace_back<__GLXcontextRec*&,bool>
              ((vector<std::pair<__GLXcontextRec*,GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>,std::allocator<std::pair<__GLXcontextRec*,GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>>>
                *)&this->m_GLProgPipelines,&local_58,(bool *)&local_50);
    ppVar2 = (this->m_GLProgPipelines).
             super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this->m_NumPrograms != '\0') {
      GVar1 = ppVar2[-1].second.m_uiHandle;
      lVar10 = 0;
      uVar9 = 0;
      do {
        SVar7 = GetShaderStageType(this,(Uint32)uVar9);
        if ((SHADER_TYPE_COMPUTE < SVar7) || ((0x100010116U >> ((ulong)SVar7 & 0x3f) & 1) == 0)) {
          SVar7 = SHADER_TYPE_UNKNOWN;
        }
        (*__glewUseProgramStages)
                  (GVar1,SVar7,
                   **(GLuint **)
                     ((long)&(this->m_GLPrograms->
                             super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr + lVar10));
        local_5c = glGetError();
        if (local_5c != 0) {
          LogError<false,char[28],char[17],unsigned_int>
                    (false,"GetGLProgramPipeline",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                     ,0x287,(char (*) [28])"glUseProgramStages() failed",
                     (char (*) [17])"\nGL Error Code: ",&local_5c);
          FormatString<char[6]>(&local_50,(char (*) [6])0x861532);
          DebugAssertionFailed
                    ((Char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                      local_50._M_dataplus._M_p._0_1_),"GetGLProgramPipeline",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                     ,0x287);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
              &local_50.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_
                                    ),local_50.field_2._M_allocated_capacity + 1);
          }
        }
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + 0x10;
      } while (uVar9 < this->m_NumPrograms);
    }
    unaff_R15 = &ppVar2[-1].second;
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>::SetName
              (unaff_R15,
               (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
               super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
               .m_Desc.super_DeviceObjectAttribs.Name);
  }
  Threading::SpinLock::unlock(this_00);
  return unaff_R15;
}

Assistant:

GLObjectWrappers::GLPipelineObj& PipelineStateGLImpl::GetGLProgramPipeline(GLContext::NativeGLContextType Context)
{
    Threading::SpinLockGuard Guard{m_ProgPipelineLock};
    for (auto& ctx_pipeline : m_GLProgPipelines)
    {
        if (ctx_pipeline.first == Context)
            return ctx_pipeline.second;
    }

    // Create new program pipeline
    m_GLProgPipelines.emplace_back(Context, true);
    auto&  ctx_pipeline = m_GLProgPipelines.back();
    GLuint Pipeline     = ctx_pipeline.second;
    for (Uint32 i = 0; i < GetNumShaderStages(); ++i)
    {
        auto GLShaderBit = ShaderTypeToGLShaderBit(GetShaderStageType(i));
        // If the program has an active code for each stage mentioned in set flags,
        // then that code will be used by the pipeline. If program is 0, then the given
        // stages are cleared from the pipeline.
        glUseProgramStages(Pipeline, GLShaderBit, m_GLPrograms[i]->GetGLHandle());
        DEV_CHECK_GL_ERROR("glUseProgramStages() failed");
    }

    ctx_pipeline.second.SetName(m_Desc.Name);

    return ctx_pipeline.second;
}